

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

MatchTool * generate_Dtran(MatchTool *__return_storage_ptr__,RegexTree *tree)

{
  pointer *ppptVar1;
  pointer *this;
  tree_node *ptVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference ppVar6;
  reference pptVar7;
  mapped_type *__x;
  reference pvVar8;
  ulong uVar9;
  size_type sVar10;
  reference piVar11;
  reference pptVar12;
  iterator __first;
  difference_type dVar13;
  reference pvVar14;
  reference pvVar15;
  allocator<int> local_435;
  value_type_conflict local_434;
  vector<int,_std::allocator<int>_> local_430;
  value_type_conflict local_414;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_410;
  size_type local_408;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_400;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_3f8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_3f0;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> local_3e8;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> local_3e0;
  int local_3d4;
  anon_class_8_1_ba1d7c77_for__M_pred aStack_3d0;
  int state_num;
  Dstate *local_3c8;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> local_3c0;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> local_3b8;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> iter;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3a0;
  int *local_398;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_390;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_388;
  int local_37c;
  iterator iStack_378;
  int j;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  iterator iStack_358;
  int state2;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> tmp;
  char ch;
  iterator iStack_320;
  int state;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  bool *i_1;
  bool *__end2;
  bool *__begin2;
  bool (*__range2) [256];
  bool alphabet [256];
  int i;
  size_type local_1d8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1d0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  int *local_1b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  tree_node *local_1a8;
  tree_node *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  StateSet *__range1_1;
  StateSet first_set;
  int curr;
  int is_marked;
  FollowPos fp;
  vector<int,_std::allocator<int>_> firstpos;
  pair<const_tree_node_*const,_int> *p;
  iterator __end1;
  iterator __begin1;
  StateMap *__range1;
  undefined1 local_f0 [8];
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> table;
  StateMap mp;
  vector<int,_std::allocator<int>_> targets;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  Dtran;
  allocator<Dstate> local_59;
  Dstate local_58;
  undefined1 local_30 [8];
  vector<Dstate,_std::allocator<Dstate>_> Dstates;
  RegexTree *tree_local;
  
  local_58.states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.mark = 0;
  local_58._4_4_ = 0;
  local_58.states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)tree;
  Dstate::Dstate(&local_58);
  std::allocator<Dstate>::allocator(&local_59);
  std::vector<Dstate,_std::allocator<Dstate>_>::vector
            ((vector<Dstate,_std::allocator<Dstate>_> *)local_30,1,&local_58,&local_59);
  std::allocator<Dstate>::~allocator(&local_59);
  Dstate::~Dstate(&local_58);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&mp._M_h._M_single_bucket);
  ppptVar1 = &table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
  ::unordered_map((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                   *)ppptVar1);
  RegexTree::number_node
            ((RegexTree *)
             Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
              *)ppptVar1);
  sVar5 = std::
          unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
          ::size((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                  *)&table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<const_tree_node_*>::allocator
            ((allocator<const_tree_node_*> *)((long)&__range1 + 7));
  std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::vector
            ((vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> *)local_f0,sVar5 + 1,
             (allocator<const_tree_node_*> *)((long)&__range1 + 7));
  std::allocator<const_tree_node_*>::~allocator
            ((allocator<const_tree_node_*> *)((long)&__range1 + 7));
  ppptVar1 = &table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
           ::begin((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                    *)ppptVar1);
  p = (pair<const_tree_node_*const,_int> *)
      std::
      unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
      ::end((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
             *)ppptVar1);
  while (bVar3 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_tree_node_*const,_int>,_false>
                            ,(_Node_iterator_base<std::pair<const_tree_node_*const,_int>,_false> *)
                             &p), bVar3) {
    ppVar6 = std::__detail::_Node_iterator<std::pair<const_tree_node_*const,_int>,_false,_false>::
             operator*(&__end1);
    ptVar2 = ppVar6->first;
    pptVar12 = std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::operator[]
                         ((vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> *)local_f0,
                          (long)ppVar6->second);
    *pptVar12 = ptVar2;
    std::__detail::_Node_iterator<std::pair<const_tree_node_*const,_int>,_false,_false>::operator++
              (&__end1);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &fp.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  RegexTree::get_followpos
            ((FollowPos *)&curr,
             (RegexTree *)
             Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (StateMap *)
             &table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  first_set._M_h._M_single_bucket._4_4_ = 0;
  first_set._M_h._M_single_bucket._0_4_ = 0;
  RegexTree::firstpos((StateSet *)&__range1_1,
                      (RegexTree *)
                      Dstates.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  __end1_1 = std::
             unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
             ::begin((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                      *)&__range1_1);
  p_1 = (tree_node *)
        std::
        unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
        ::end((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
               *)&__range1_1);
  while (bVar3 = std::__detail::operator!=
                           (&__end1_1.super__Node_iterator_base<const_tree_node_*,_false>,
                            (_Node_iterator_base<const_tree_node_*,_false> *)&p_1), bVar3) {
    pptVar7 = std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator*(&__end1_1);
    local_1a8 = *pptVar7;
    __x = std::
          unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
          ::at((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                *)&table.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &fp.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    std::__detail::_Node_iterator<const_tree_node_*,_true,_false>::operator++(&__end1_1);
  }
  this = &fp.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)this);
  local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)this);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_1b0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1b8)
  ;
  pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::front
                     ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
  std::vector<int,_std::allocator<int>_>::operator=
            (&pvVar8->states,
             (vector<int,_std::allocator<int>_> *)
             &fp.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::front
                     ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
  local_1c8._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(&pvVar8->states);
  pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::front
                     ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
  local_1d0._M_current = (int *)std::vector<int,_std::allocator<int>_>::cend(&pvVar8->states);
  local_1d8 = std::
              unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
              ::size((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                      *)&table.
                         super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1c0 = std::
              find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_long>
                        (local_1c8,local_1d0,&local_1d8);
  pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::front
                     ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
  _i = std::vector<int,_std::allocator<int>_>::cend(&pvVar8->states);
  bVar3 = __gnu_cxx::operator!=
                    (&local_1c0,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
  if (bVar3) {
    alphabet[0xfc] = true;
    alphabet[0xfd] = false;
    alphabet[0xfe] = false;
    alphabet[0xff] = false;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&mp._M_h._M_single_bucket,
               (value_type_conflict *)(alphabet + 0xfc));
  }
  do {
    uVar9 = (ulong)first_set._M_h._M_single_bucket._4_4_;
    sVar10 = std::vector<Dstate,_std::allocator<Dstate>_>::size
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
    if (sVar10 <= uVar9) {
      MatchTool::MatchTool
                (__return_storage_ptr__,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)&mp._M_h._M_single_bucket);
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::~unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                        *)&__range1_1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&curr);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &fp.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::~vector
                ((vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> *)local_f0);
      std::
      unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
      ::~unordered_map((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                        *)&table.
                           super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&mp._M_h._M_single_bucket);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      std::vector<Dstate,_std::allocator<Dstate>_>::~vector
                ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
      return __return_storage_ptr__;
    }
    alphabet[0xf8] = false;
    alphabet[0xf9] = false;
    alphabet[0xfa] = false;
    alphabet[0xfb] = false;
    for (; uVar9 = (ulong)(int)alphabet._248_4_,
        sVar10 = std::vector<Dstate,_std::allocator<Dstate>_>::size
                           ((vector<Dstate,_std::allocator<Dstate>_> *)local_30), uVar9 < sVar10;
        alphabet._248_4_ = alphabet._248_4_ + 1) {
      pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::operator[]
                         ((vector<Dstate,_std::allocator<Dstate>_> *)local_30,
                          (long)(int)alphabet._248_4_);
      if (pvVar8->mark == -1) {
        first_set._M_h._M_single_bucket._0_1_ = alphabet[0xf8];
        first_set._M_h._M_single_bucket._1_1_ = alphabet[0xf9];
        first_set._M_h._M_single_bucket._2_1_ = alphabet[0xfa];
        first_set._M_h._M_single_bucket._3_1_ = alphabet[0xfb];
        break;
      }
    }
    iVar4 = first_set._M_h._M_single_bucket._4_4_ + 1;
    first_set._M_h._M_single_bucket._4_4_ = iVar4;
    pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::operator[]
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30,
                        (long)(int)first_set._M_h._M_single_bucket);
    pvVar8->mark = iVar4;
    for (__end2 = (bool *)&__range2; __end2 != alphabet + 0xf8; __end2 = __end2 + 1) {
      *__end2 = false;
    }
    alphabet[7] = true;
    pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::operator[]
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30,
                        (long)(int)first_set._M_h._M_single_bucket);
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin(&pvVar8->states);
    iStack_320 = std::vector<int,_std::allocator<int>_>::end(&pvVar8->states);
    while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffce0), bVar3) {
      piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2_1);
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = *piVar11;
      pptVar12 = std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::operator[]
                           ((vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> *)
                            local_f0,(long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage._4_4_);
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = (*pptVar12)->c;
      if ((alphabet[(long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._3_1_ + -8] & 1U) == 0) {
        alphabet[(long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._3_1_ + -8] = true;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&__range3);
        pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::operator[]
                           ((vector<Dstate,_std::allocator<Dstate>_> *)local_30,
                            (long)(int)first_set._M_h._M_single_bucket);
        __end3 = std::vector<int,_std::allocator<int>_>::begin(&pvVar8->states);
        iStack_358 = std::vector<int,_std::allocator<int>_>::end(&pvVar8->states);
        while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffca8), bVar3) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3);
          iVar4 = *piVar11;
          pptVar12 = std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::operator[]
                               ((vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> *)
                                local_f0,(long)iVar4);
          if ((*pptVar12)->c ==
              tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._3_1_) {
            pvVar14 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&curr,(long)iVar4);
            __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar14);
            iStack_378 = std::vector<int,_std::allocator<int>_>::end(pvVar14);
            while (bVar3 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffc88), bVar3) {
              piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end5);
              local_37c = *piVar11;
              local_390._M_current =
                   (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)&__range3);
              local_398 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)&__range3);
              local_388 = std::
                          find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                    (local_390,
                                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_398,&local_37c);
              local_3a0._M_current =
                   (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)&__range3);
              bVar3 = __gnu_cxx::operator==(&local_388,&local_3a0);
              if (bVar3) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)&__range3,&local_37c);
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end5);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
        __first = std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&__range3);
        iter._M_current =
             (Dstate *)
             std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range3);
        std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __first._M_current,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   iter._M_current);
        local_3c0._M_current =
             (Dstate *)
             std::vector<Dstate,_std::allocator<Dstate>_>::begin
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
        local_3c8 = (Dstate *)
                    std::vector<Dstate,_std::allocator<Dstate>_>::end
                              ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
        aStack_3d0.tmp = (vector<int,_std::allocator<int>_> *)&__range3;
        local_3b8 = std::
                    find_if<__gnu_cxx::__normal_iterator<Dstate*,std::vector<Dstate,std::allocator<Dstate>>>,generate_Dtran(RegexTree_const&)::__0>
                              (local_3c0,
                               (__normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_>
                                )local_3c8,aStack_3d0);
        local_3e0._M_current =
             (Dstate *)
             std::vector<Dstate,_std::allocator<Dstate>_>::begin
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
        dVar13 = __gnu_cxx::operator-(&local_3b8,&local_3e0);
        local_3d4 = (int)dVar13 + 1;
        local_3e8._M_current =
             (Dstate *)
             std::vector<Dstate,_std::allocator<Dstate>_>::end
                       ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
        bVar3 = __gnu_cxx::operator==(&local_3b8,&local_3e8);
        if (bVar3) {
          std::vector<Dstate,_std::allocator<Dstate>_>::emplace_back<>
                    ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
          local_3f8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::cbegin
                                ((vector<int,_std::allocator<int>_> *)&__range3);
          local_400._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::cend
                                ((vector<int,_std::allocator<int>_> *)&__range3);
          local_408 = std::
                      unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                      ::size((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                              *)&table.
                                 super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_3f0 = std::
                      find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_long>
                                (local_3f8,local_400,&local_408);
          local_410._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::cend
                                ((vector<int,_std::allocator<int>_> *)&__range3);
          bVar3 = __gnu_cxx::operator!=(&local_3f0,&local_410);
          if (bVar3) {
            sVar10 = std::vector<Dstate,_std::allocator<Dstate>_>::size
                               ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
            local_414 = (value_type_conflict)sVar10;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&mp._M_h._M_single_bucket,&local_414);
          }
          pvVar8 = std::vector<Dstate,_std::allocator<Dstate>_>::back
                             ((vector<Dstate,_std::allocator<Dstate>_> *)local_30);
          std::vector<int,_std::allocator<int>_>::operator=
                    (&pvVar8->states,(vector<int,_std::allocator<int>_> *)&__range3);
        }
        sVar10 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (sVar10 < (ulong)(long)(first_set._M_h._M_single_bucket._4_4_ + 1)) {
          iVar4 = first_set._M_h._M_single_bucket._4_4_ + 1;
          local_434 = 0;
          std::allocator<int>::allocator(&local_435);
          std::vector<int,_std::allocator<int>_>::vector(&local_430,0x100,&local_434,&local_435);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)iVar4,&local_430);
          std::vector<int,_std::allocator<int>_>::~vector(&local_430);
          std::allocator<int>::~allocator(&local_435);
        }
        iVar4 = local_3d4;
        pvVar14 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                               (long)first_set._M_h._M_single_bucket._4_4_);
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                            (pvVar14,(long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage._3_1_);
        *pvVar15 = iVar4;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)&__range3);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
  } while( true );
}

Assistant:

MatchTool generate_Dtran(const RegexTree& tree) {
    std::vector<Dstate> Dstates(1, Dstate());
    std::vector<std::vector<int>> Dtran;
    std::vector<int> targets;
    RegexTree::StateMap mp;
    tree.number_node(mp);
    std::vector<const tree_node *> table(mp.size() + 1);
    for (const auto &p : mp)
        table[p.second] = p.first;
    std::vector<int> firstpos;
    RegexTree::FollowPos fp = tree.get_followpos(mp);
    int is_marked = 0;
    int curr = 0;

    RegexTree::StateSet first_set = tree.firstpos();
    for (const tree_node *p : first_set) firstpos.push_back(mp.at(p));
    std::sort(firstpos.begin(), firstpos.end());
    Dstates.front().states = firstpos;
    if (std::find(Dstates.front().states.cbegin(),
            Dstates.front().states.cend(), mp.size()) != Dstates.front().states.cend())
        targets.push_back(1);

    while (is_marked < Dstates.size()) {
        for (int i = 0; i < Dstates.size(); i++)
            if (Dstates[i].mark == -1) {
                curr = i;
                break;
            }
        ++is_marked;
        Dstates[curr].mark = is_marked; // mark this state

        bool alphabet[256];
        for (bool &i : alphabet)
            i = false;
        alphabet[ACCEPT] = true;

        for (int state : Dstates[curr].states) {
            char ch = table[state]->c;
            if (alphabet[ch])
                continue;
            else
                alphabet[ch] = true;

            std::vector<int> tmp;
            for (int state2 : Dstates[curr].states) {
                if (table[state2]->c == ch)
                    for (int j : fp[state2]) {
                        if (std::find(tmp.begin(), tmp.end(), j) == tmp.end())
                            tmp.push_back(j);
                    }
            }
            std::sort(tmp.begin(), tmp.end());

            auto iter = std::find_if(Dstates.begin(), Dstates.end(), [&tmp](Dstate &s) {
                return s.states == tmp;
            });
            int state_num = static_cast<int>(iter - Dstates.begin()) + 1;
            if (iter == Dstates.end()) {
                Dstates.emplace_back();
                if (std::find(tmp.cbegin(), tmp.cend(), mp.size()) != tmp.cend())
                    targets.push_back(static_cast<int>(Dstates.size()));
                Dstates.back().states = std::move(tmp);
            }
            if (Dtran.size() < is_marked + 1)
                Dtran.resize(static_cast<unsigned long>(is_marked + 1) // NOLINT
                        , std::vector<int>(256, 0));
            Dtran[is_marked][ch] = state_num;
        }
    }
    return MatchTool(std::move(Dtran), std::move(targets));
}